

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolidDelegate.cpp
# Opt level: O0

void __thiscall MeshLib::SolidDelegate::removeFace(SolidDelegate *this,Solid *pS,Face *f)

{
  Vertex *pVVar1;
  HalfEdge *pHVar2;
  Edge *this_00;
  bool bVar3;
  HalfEdge **ppHVar4;
  Vertex **ppVVar5;
  tEdge this_01;
  Edge **ppEVar6;
  Edge *e_1;
  HalfEdge *nhe;
  HalfEdge *hhe;
  Edge *e;
  undefined1 local_158 [8];
  SolidEdgeIterator eiter;
  Vertex *v;
  HalfEdge *he;
  int i;
  Face *f_local;
  Solid *pS_local;
  SolidDelegate *this_local;
  
  ppHVar4 = Face::halfedge(f);
  v = (Vertex *)*ppHVar4;
  he._4_4_ = 0;
  do {
    if (2 < he._4_4_) {
      for (he._4_4_ = 0; he._4_4_ < 3; he._4_4_ = he._4_4_ + 1) {
        ppHVar4 = HalfEdge::he_next((HalfEdge *)v);
        pVVar1 = (Vertex *)*ppHVar4;
        ppEVar6 = HalfEdge::edge((HalfEdge *)v);
        this_00 = *ppEVar6;
        ppHVar4 = Edge::halfedge(this_00,1);
        if (*ppHVar4 == (HalfEdge *)0x0) {
          removeEdge(this,pS,this_00);
          if (this_00 != (Edge *)0x0) {
            Edge::~Edge(this_00);
            operator_delete(this_00);
          }
          if (v != (Vertex *)0x0) {
            HalfEdge::~HalfEdge((HalfEdge *)v);
            operator_delete(v);
          }
        }
        else {
          ppHVar4 = Edge::halfedge(this_00,0);
          if ((Vertex *)*ppHVar4 == v) {
            ppHVar4 = Edge::halfedge(this_00,1);
            pHVar2 = *ppHVar4;
            ppHVar4 = Edge::halfedge(this_00,0);
            *ppHVar4 = pHVar2;
          }
          if (v != (Vertex *)0x0) {
            HalfEdge::~HalfEdge((HalfEdge *)v);
            operator_delete(v);
          }
          ppHVar4 = Edge::halfedge(this_00,1);
          *ppHVar4 = (HalfEdge *)0x0;
        }
        v = pVVar1;
      }
      AVL::Tree<MeshLib::Face>::remove(&pS->m_faces,(char *)f);
      return;
    }
    ppHVar4 = HalfEdge::he_next((HalfEdge *)v);
    v = (Vertex *)*ppHVar4;
    ppVVar5 = HalfEdge::target((HalfEdge *)v);
    eiter.m_iter.m_root = (Node<MeshLib::Edge> *)*ppVVar5;
    ppHVar4 = Vertex::halfedge((Vertex *)eiter.m_iter.m_root);
    if ((Vertex *)*ppHVar4 == v) {
      SolidEdgeIterator::SolidEdgeIterator((SolidEdgeIterator *)local_158,pS);
      while (bVar3 = SolidEdgeIterator::end((SolidEdgeIterator *)local_158),
            ((bVar3 ^ 0xffU) & 1) != 0) {
        this_01 = SolidEdgeIterator::operator*((SolidEdgeIterator *)local_158);
        ppHVar4 = Edge::halfedge(this_01,0);
        pVVar1 = (Vertex *)*ppHVar4;
        ppVVar5 = HalfEdge::target((HalfEdge *)pVVar1);
        if ((*ppVVar5 == (Vertex *)eiter.m_iter.m_root) && (pVVar1 != v)) {
          ppHVar4 = Vertex::halfedge((Vertex *)eiter.m_iter.m_root);
          *ppHVar4 = (HalfEdge *)pVVar1;
          break;
        }
        ppHVar4 = Edge::halfedge(this_01,1);
        if (*ppHVar4 != (HalfEdge *)0x0) {
          ppHVar4 = Edge::halfedge(this_01,1);
          ppVVar5 = HalfEdge::target(*ppHVar4);
          if ((*ppVVar5 == (Vertex *)eiter.m_iter.m_root) &&
             (ppHVar4 = Edge::halfedge(this_01,1), (Vertex *)*ppHVar4 != v)) {
            ppHVar4 = Edge::halfedge(this_01,1);
            pHVar2 = *ppHVar4;
            ppHVar4 = Vertex::halfedge((Vertex *)eiter.m_iter.m_root);
            *ppHVar4 = pHVar2;
            break;
          }
        }
        SolidEdgeIterator::operator++((SolidEdgeIterator *)local_158);
      }
      SolidEdgeIterator::~SolidEdgeIterator((SolidEdgeIterator *)local_158);
    }
    ppHVar4 = Vertex::halfedge((Vertex *)eiter.m_iter.m_root);
    if ((Vertex *)*ppHVar4 == v) {
      ppHVar4 = Vertex::halfedge((Vertex *)eiter.m_iter.m_root);
      *ppHVar4 = (HalfEdge *)0x0;
    }
    he._4_4_ = he._4_4_ + 1;
  } while( true );
}

Assistant:

void SolidDelegate::removeFace (Solid * pS, Face * f) 
{
	int i;
	HalfEdge * he = f->halfedge ();
	for(i=0; i<3; i++)
	{
		he = he->he_next ();
		Vertex * v = he->target ();
		if(v->halfedge () == he)
		{
			for(SolidEdgeIterator eiter(pS); !eiter.end (); ++eiter)
			{
				Edge * e = *eiter;
				HalfEdge * hhe = e->halfedge (0);
				if(hhe->target () == v && hhe != he)
				{
					v->halfedge () = hhe;
					break;
				}
				else if (e->halfedge (1) != NULL && e->halfedge (1)->target () == v && e->halfedge (1) != he)
				{
					v->halfedge () = e->halfedge (1);
					break;
				}
			}
		}
		if(v->halfedge () == he)
			v->halfedge () = NULL;
	}
	for(i=0; i<3; i++)
	{
		HalfEdge * nhe = he->he_next ();
	//	Vertex * v = he->target ();
		Edge * e = he->edge ();
		if(e->halfedge (1) == NULL)
		{
			removeEdge(pS, e);
			delete e;
			delete he;
		}
		else
		{
			if(e->halfedge (0) == he)
				e->halfedge (0) = e->halfedge (1);
			delete he;
			e->halfedge(1) = NULL;
		}
		he = nhe;
	}

	pS->m_faces.remove(f);
}